

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

MemorySize * __thiscall wasm::Builder::makeMemorySize(Builder *this,Name memoryName,MemoryInfo info)

{
  Name memoryName_00;
  bool bVar1;
  MemorySize *this_00;
  MemorySize *ret;
  MemoryInfo info_local;
  Builder *this_local;
  Name memoryName_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  this_local = memoryName.super_IString.str._M_len;
  this_00 = MixedArena::alloc<wasm::MemorySize>(&this->wasm->allocator);
  memoryName_00.super_IString.str._M_str = (char *)memoryName_local.super_IString.str._M_len;
  memoryName_00.super_IString.str._M_len = (size_t)this_local;
  bVar1 = isMemory64(this,memoryName_00,info);
  if (bVar1) {
    MemorySize::make64(this_00);
  }
  wasm::Name::operator=(&this_00->memory,(Name *)&this_local);
  MemorySize::finalize(this_00);
  return this_00;
}

Assistant:

MemorySize* makeMemorySize(Name memoryName,
                             MemoryInfo info = MemoryInfo::Unspecified) {
    auto* ret = wasm.allocator.alloc<MemorySize>();
    if (isMemory64(memoryName, info)) {
      ret->make64();
    }
    ret->memory = memoryName;
    ret->finalize();
    return ret;
  }